

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O1

void miniros::disableAllSignalsInThisThread(void)

{
  sigset_t signal_set;
  sigset_t sStack_88;
  
  sigfillset(&sStack_88);
  pthread_sigmask(0,&sStack_88,(__sigset_t *)0x0);
  return;
}

Assistant:

void disableAllSignalsInThisThread()
{
#if !defined(WIN32)
  // pthreads_win32, despite having an implementation of pthread_sigmask,
  // doesn't have an implementation of sigset_t, and also doesn't expose its
  // pthread_sigmask externally.
  sigset_t signal_set;

  /* block all signals */
  sigfillset( &signal_set );
  pthread_sigmask( SIG_BLOCK, &signal_set, NULL );
#endif
}